

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_coroutine.hpp
# Opt level: O1

int __thiscall squall::Coroutine::yielded<int>(Coroutine *this)

{
  HSQUIRRELVM vm;
  int in_EAX;
  longlong r;
  int local_18 [2];
  
  local_18[0] = in_EAX;
  validate_vm(this);
  vm = this->vm_;
  detail::check_argument_type<(squall::detail::FetchContext)4>(vm,-1,OT_INTEGER);
  sq_getinteger(vm,-1,(SQInteger *)local_18);
  return local_18[0];
}

Assistant:

R yielded() {
        validate_vm();
        return detail::fetch<R, detail::FetchContext::YieldedValue>(vm_, -1);
    }